

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryFunctions.cpp
# Opt level: O0

bool helics::waitForFed(Federate *fed,string_view fedName,milliseconds timeout)

{
  string_view queryStr;
  string_view queryStr_00;
  undefined1 uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  Federate *in_RSI;
  duration<long,_std::ratio<1L,_1000L>_> *in_RDI;
  string_view in_stack_00000000;
  HelicsSequencingModes in_stack_00000020;
  milliseconds delta;
  milliseconds waitTime;
  string res;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  strong_ordering in_stack_ffffffffffffff0f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff20;
  __unspec local_ca;
  type local_c9;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> local_a8 [3];
  undefined8 local_78;
  undefined1 local_70 [88];
  Federate *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff10,
             (char *)CONCAT17(in_stack_ffffffffffffff0f._M_value,in_stack_ffffffffffffff08));
  uVar3 = 0;
  queryStr._M_str._0_7_ = in_stack_fffffffffffffff8;
  queryStr._M_len = (size_t)in_RDX;
  queryStr._M_str._7_1_ = in_stack_ffffffffffffffff;
  Federate::query_abi_cxx11_(in_RSI,in_stack_00000000,queryStr,in_stack_00000020);
  memset(local_70,0,8);
  local_78 = 400;
  do {
    uVar1 = std::operator==(in_stack_ffffffffffffff00,
                            (char *)CONCAT44(in_stack_fffffffffffffefc,uVar3));
    if (((uVar1 ^ 0xff) & 1) == 0) {
      bVar5 = 1;
      goto LAB_0040bdba;
    }
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_ffffffffffffff40);
    this = in_RSI;
    pbVar4 = in_RDX;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff10,
               (char *)CONCAT17(in_stack_ffffffffffffff0f._M_value,in_stack_ffffffffffffff08));
    uVar3 = 0;
    queryStr_00._M_str._0_7_ = in_stack_fffffffffffffff8;
    queryStr_00._M_len = (size_t)pbVar4;
    queryStr_00._M_str._7_1_ = in_stack_ffffffffffffffff;
    Federate::query_abi_cxx11_(this,in_stack_00000000,queryStr_00,in_stack_00000020);
    in_stack_ffffffffffffff10 = local_a8;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
    std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff00,
               (duration<long,_std::ratio<1L,_1000L>_> *)CONCAT44(in_stack_fffffffffffffefc,uVar3));
    in_stack_ffffffffffffff0f =
         std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                   (in_RDI,(duration<long,_std::ratio<1L,_1000L>_> *)
                           CONCAT17(uVar1,in_stack_ffffffffffffff20));
    local_c9 = in_stack_ffffffffffffff0f._M_value;
    CLI::std::__cmp_cat::__unspec::__unspec(&local_ca,(__unspec *)0x0);
    bVar2 = std::operator>=(local_c9);
    in_RSI = this;
    in_RDX = pbVar4;
  } while (!bVar2);
  bVar5 = 0;
LAB_0040bdba:
  std::__cxx11::string::~string(in_stack_ffffffffffffff00);
  return (bool)(bVar5 & 1);
}

Assistant:

bool waitForFed(helics::Federate* fed, std::string_view fedName, std::chrono::milliseconds timeout)
{
    auto res = fed->query(fedName, "exists");
    std::chrono::milliseconds waitTime{0};
    const std::chrono::milliseconds delta{400};
    while (res != "true") {
        std::this_thread::sleep_for(delta);
        res = fed->query(fedName, "exists");
        waitTime += delta;
        if (waitTime >= timeout) {
            return false;
        }
    }
    return true;
}